

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

uECC_word_t
EccPoint_compute_public_key(uECC_word_t *result,uECC_word_t *private_key,uECC_Curve curve)

{
  uECC_word_t *puVar1;
  byte bVar2;
  int iVar3;
  uECC_word_t uVar4;
  ulong uVar5;
  uECC_word_t uVar6;
  uint uVar7;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  undefined1 auVar8 [16];
  uECC_word_t *p2 [2];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_word_t *local_68 [2];
  uECC_word_t local_58 [4];
  uECC_word_t local_38 [4];
  
  local_68[0] = local_38;
  local_68[1] = local_58;
  uVar4 = regularize_k(private_key,local_68[0],local_68[1],curve);
  uVar6 = 0;
  EccPoint_mult(result,curve->G,local_68[uVar4 ^ 1],(uECC_word_t *)0x0,curve->num_n_bits + 1,curve);
  bVar2 = curve->num_words * '\x02';
  if ('\0' < (char)bVar2) {
    uVar7 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar5 = 0;
    do {
      puVar1 = result + uVar5;
      uVar7 = uVar7 | (uint)*puVar1;
      uVar9 = uVar9 | *(uint *)((long)puVar1 + 4);
      uVar10 = uVar10 | (uint)puVar1[1];
      uVar11 = uVar11 | *(uint *)((long)puVar1 + 0xc);
      uVar5 = uVar5 + 2;
    } while (bVar2 != uVar5);
    auVar8._0_4_ = -(uint)(uVar7 == 0);
    auVar8._4_4_ = -(uint)(uVar9 == 0);
    auVar8._8_4_ = -(uint)(uVar10 == 0);
    auVar8._12_4_ = -(uint)(uVar11 == 0);
    iVar3 = movmskps((uint)bVar2,auVar8);
    uVar6 = (uECC_word_t)(iVar3 != 0xf);
  }
  return uVar6;
}

Assistant:

static uECC_word_t EccPoint_compute_public_key(uECC_word_t *result,
                                               uECC_word_t *private_key,
                                               uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {tmp1, tmp2};
    uECC_word_t carry;

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(private_key, tmp1, tmp2, curve);

    EccPoint_mult(result, curve->G, p2[!carry], 0, curve->num_n_bits + 1, curve);

    if (EccPoint_isZero(result, curve)) {
        return 0;
    }
    return 1;
}